

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

TapScriptFromStringRequestStruct * __thiscall
cfd::js::api::json::TapScriptFromStringRequest::ConvertToStruct
          (TapScriptFromStringRequestStruct *__return_storage_ptr__,TapScriptFromStringRequest *this
          )

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined1 local_19;
  TapScriptFromStringRequest *local_18;
  TapScriptFromStringRequest *this_local;
  TapScriptFromStringRequestStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (TapScriptFromStringRequest *)__return_storage_ptr__;
  TapScriptFromStringRequestStruct::TapScriptFromStringRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->network_);
  __return_storage_ptr__->is_elements = (bool)(this->is_elements_ & 1);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->tree_string,(string *)&this->tree_string_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->tapscript,(string *)&this->tapscript_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->internal_pubkey,(string *)&this->internal_pubkey_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->internal_privkey,(string *)&this->internal_privkey_)
  ;
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct(&local_48,&this->nodes_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->nodes,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

TapScriptFromStringRequestStruct TapScriptFromStringRequest::ConvertToStruct() const {  // NOLINT
  TapScriptFromStringRequestStruct result;
  result.network = network_;
  result.is_elements = is_elements_;
  result.tree_string = tree_string_;
  result.tapscript = tapscript_;
  result.internal_pubkey = internal_pubkey_;
  result.internal_privkey = internal_privkey_;
  result.nodes = nodes_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}